

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_extra_field_api.c
# Opt level: O0

zip_int16_t zip_file_extra_fields_count(zip_t *za,zip_uint64_t idx,zip_flags_t flags)

{
  int iVar1;
  zip_dirent_t *pzVar2;
  short local_3a;
  zip_extra_field_t *pzStack_38;
  zip_uint16_t n;
  zip_extra_field_t *ef;
  zip_dirent_t *de;
  zip_flags_t flags_local;
  zip_uint64_t idx_local;
  zip_t *za_local;
  
  if ((flags & 0x300) == 0) {
    zip_error_set(&za->error,0x12,0);
    za_local._6_2_ = -1;
  }
  else {
    pzVar2 = _zip_get_dirent(za,idx,flags,&za->error);
    if (pzVar2 == (zip_dirent_t *)0x0) {
      za_local._6_2_ = -1;
    }
    else if (((flags & 0x100) == 0) || (iVar1 = _zip_read_local_ef(za,idx), -1 < iVar1)) {
      local_3a = 0;
      for (pzStack_38 = pzVar2->extra_fields; pzStack_38 != (zip_extra_field_t *)0x0;
          pzStack_38 = pzStack_38->next) {
        if ((pzStack_38->flags & flags & 0x300) != 0) {
          local_3a = local_3a + 1;
        }
      }
      za_local._6_2_ = local_3a;
    }
    else {
      za_local._6_2_ = -1;
    }
  }
  return za_local._6_2_;
}

Assistant:

ZIP_EXTERN zip_int16_t
zip_file_extra_fields_count(zip_t *za, zip_uint64_t idx, zip_flags_t flags) {
    zip_dirent_t *de;
    zip_extra_field_t *ef;
    zip_uint16_t n;

    if ((flags & ZIP_EF_BOTH) == 0) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return -1;
    }

    if ((de = _zip_get_dirent(za, idx, flags, &za->error)) == NULL)
	return -1;

    if (flags & ZIP_FL_LOCAL)
	if (_zip_read_local_ef(za, idx) < 0)
	    return -1;

    n = 0;
    for (ef = de->extra_fields; ef; ef = ef->next)
	if (ef->flags & flags & ZIP_EF_BOTH)
	    n++;

    return (zip_int16_t)n;
}